

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O0

QString * __thiscall
DebugDirCVEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this,size_t fId)

{
  size_t fId_local;
  DebugDirCVEntryWrapper *this_local;
  
  switch(fId) {
  case 0:
    QString::QString(__return_storage_ptr__,"CvSig");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"Signature");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"Age");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"PDB");
    break;
  default:
    QString::QString(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getFieldName(size_t fId)
{
    switch (fId) {
        case F_CVDBG_SIGN: return "CvSig";
        case F_CVDBG_GUID: return "Signature";
        case F_CVDBG_AGE: return "Age";
        case F_CVDBG_PDB: return "PDB";
    }
    return "";
}